

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::generate_css(t_html_generator *this)

{
  int __oflag;
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *poVar1;
  t_html_generator *this_01;
  string css_fname;
  allocator local_59;
  _Alloc_hider local_38;
  
  if (this->standalone_ == false) {
    std::__cxx11::string::assign((char *)&this->current_file_);
    (*(this->super_t_generator)._vptr_t_generator[0x1b])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffffa8,this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffa8,&this->current_file_);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,local_38._M_p,&local_59);
    this_00 = &this->f_out_;
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              (this_00,&stack0xffffffffffffffa8,__oflag);
    this_01 = (t_html_generator *)&stack0xffffffffffffffa8;
    std::__cxx11::string::~string((string *)this_01);
    poVar1 = this_00;
    generate_css_content(this_01,(ostream *)this_00);
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              (this_00,(int)poVar1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void t_html_generator::generate_css() {
  if (!standalone_) {
    current_file_ = "style.css";
    string css_fname = get_out_dir() + current_file_;
    f_out_.open(css_fname.c_str());
    generate_css_content(f_out_);
    f_out_.close();
  }
}